

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiler_unittest.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  __pid_t _Var2;
  int iVar3;
  
  if (argc < 2) {
    fprintf(_stderr,"USAGE: %s <iters> [num_threads] [filename]\n",*argv);
    fwrite("   iters: How many million times to run the XOR test.\n",0x36,1,_stderr);
    fwrite("   num_threads: how many concurrent threads.\n",0x2d,1,_stderr);
    fwrite("                0 or 1 for single-threaded mode,\n",0x31,1,_stderr);
    fwrite("                -# to fork instead of thread.\n",0x2e,1,_stderr);
    fwrite("   filename: The name of the output profile.\n",0x2d,1,_stderr);
    fwrite("             If you don\'t specify, set CPUPROFILE in the environment instead!\n",0x4e,1
           ,_stderr);
LAB_00101482:
    iVar3 = 1;
  }
  else {
    g_iters = atoi(argv[1]);
    bVar1 = true;
    if (argc == 2) {
      iVar3 = 1;
    }
    else {
      iVar3 = atoi(argv[2]);
      if ((3 < (uint)argc) && (argv[3] != (char *)0x0)) {
        ProfilerStart();
        bVar1 = false;
      }
    }
    test_main_thread();
    ProfilerFlush();
    if (iVar3 < 1) {
      for (; iVar3 != 0; iVar3 = iVar3 + 1) {
        if (!bVar1) {
          puts("FORK test only makes sense when no filename is specified.");
          return 2;
        }
        _Var2 = fork();
        if (_Var2 == 0) {
          iVar3 = execl(*argv,*argv,argv[1],0);
          return iVar3;
        }
        if (_Var2 == -1) {
          puts("FORK failed!");
          goto LAB_00101482;
        }
        wait((void *)0x0);
      }
    }
    else {
      RunManyThreads(test_other_thread,iVar3);
    }
    test_main_thread();
    iVar3 = 0;
    if (!bVar1) {
      ProfilerStop();
    }
  }
  return iVar3;
}

Assistant:

int main(int argc, char** argv) {
  if ( argc <= 1 ) {
    fprintf(stderr, "USAGE: %s <iters> [num_threads] [filename]\n", argv[0]);
    fprintf(stderr, "   iters: How many million times to run the XOR test.\n");
    fprintf(stderr, "   num_threads: how many concurrent threads.\n");
    fprintf(stderr, "                0 or 1 for single-threaded mode,\n");
    fprintf(stderr, "                -# to fork instead of thread.\n");
    fprintf(stderr, "   filename: The name of the output profile.\n");
    fprintf(stderr, ("             If you don't specify, set CPUPROFILE "
                     "in the environment instead!\n"));
    return 1;
  }

  g_iters = atoi(argv[1]);
  int num_threads = 1;
  const char* filename = nullptr;
  if (argc > 2) {
    num_threads = atoi(argv[2]);
  }
  if (argc > 3) {
    filename = argv[3];
  }

  if (filename) {
    ProfilerStart(filename);
  }

  test_main_thread();

  ProfilerFlush();                           // just because we can

  // The other threads, if any, will run only half as long as the main thread
  if(num_threads > 0) {
    RunManyThreads(test_other_thread, num_threads);
  } else {
  // Or maybe they asked to fork.  The fork test is only interesting
  // when we use CPUPROFILE to name, so check for that
#ifdef HAVE_UNISTD_H
    for (; num_threads < 0; ++num_threads) {   // -<num_threads> to fork
      if (filename) {
        printf("FORK test only makes sense when no filename is specified.\n");
        return 2;
      }
      switch (fork()) {
        case -1:
          printf("FORK failed!\n");
          return 1;
        case 0:             // child
          return execl(argv[0], argv[0], argv[1], nullptr);
        default:
          wait(nullptr);       // we'll let the kids run one at a time
      }
    }
#else
    fprintf(stderr, "%s was compiled without support for fork() and exec()\n", argv[0]);
#endif
  }

  test_main_thread();

  if (filename) {
    ProfilerStop();
  }

  return 0;
}